

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
* deqp::gles31::Functional::NegativeTestShared::getNegativeFragmentApiTestFunctions(void)

{
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>>
  *in_RDI;
  FunctionContainer funcs [27];
  allocator_type local_299;
  FunctionContainer local_298 [27];
  
  memcpy(local_298,&DAT_00a194f0,0x288);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>>
  ::vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer*,void>
            (in_RDI,local_298,(FunctionContainer *)&stack0xfffffffffffffff0,&local_299);
  return (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
          *)in_RDI;
}

Assistant:

std::vector<FunctionContainer> getNegativeFragmentApiTestFunctions ()
{
	FunctionContainer funcs[] =
	{
		{scissor,					"scissor",					"Invalid glScissor() usage"					},
		{depth_func,				"depth_func",				"Invalid glDepthFunc() usage"				},
		{viewport,					"viewport",					"Invalid glViewport() usage"				},
		{stencil_func,				"stencil_func",				"Invalid glStencilFunc() usage"				},
		{stencil_func_separate,		"stencil_func_separate",	"Invalid glStencilFuncSeparate() usage"		},
		{stencil_op,				"stencil_op",				"Invalid glStencilOp() usage"				},
		{stencil_op_separate,		"stencil_op_separate",		"Invalid glStencilOpSeparate() usage"		},
		{stencil_mask_separate,		"stencil_mask_separate",	"Invalid glStencilMaskSeparate() usage"		},
		{blend_equation,			"blend_equation",			"Invalid glBlendEquation() usage"			},
		{blend_equationi,			"blend_equationi",			"Invalid glBlendEquationi() usage"			},
		{blend_equation_separate,	"blend_equation_separate",	"Invalid glBlendEquationSeparate() usage"	},
		{blend_equation_separatei,	"blend_equation_separatei",	"Invalid glBlendEquationSeparatei() usage"	},
		{blend_func,				"blend_func",				"Invalid glBlendFunc() usage"				},
		{blend_funci,				"blend_funci",				"Invalid glBlendFunci() usage"				},
		{blend_func_separate,		"blend_func_separate",		"Invalid glBlendFuncSeparate() usage"		},
		{blend_func_separatei,		"blend_func_separatei",		"Invalid glBlendFuncSeparatei() usage"		},
		{cull_face,					"cull_face",				"Invalid glCullFace() usage"				},
		{front_face,				"front_face",				"Invalid glFrontFace() usage"				},
		{line_width,				"line_width",				"Invalid glLineWidth() usage"				},
		{gen_queries,				"gen_queries",				"Invalid glGenQueries() usage"				},
		{begin_query,				"begin_query",				"Invalid glBeginQuery() usage"				},
		{end_query,					"end_query",				"Invalid glEndQuery() usage"				},
		{delete_queries,			"delete_queries",			"Invalid glDeleteQueries() usage"			},
		{fence_sync,				"fence_sync",				"Invalid glFenceSync() usage"				},
		{wait_sync,					"wait_sync",				"Invalid glWaitSync() usage"				},
		{client_wait_sync,			"client_wait_sync",			"Invalid glClientWaitSync() usage"			},
		{delete_sync,				"delete_sync",				"Invalid glDeleteSync() usage"				},
	};

	return std::vector<FunctionContainer>(DE_ARRAY_BEGIN(funcs), DE_ARRAY_END(funcs));
}